

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestEventStream.cpp
# Opt level: O0

bool binlog::operator==(ClockSync *a,ClockSync *b)

{
  long *in_RSI;
  long *in_RDI;
  __type local_11;
  
  local_11 = false;
  if ((((*in_RDI == *in_RSI) && (local_11 = false, in_RDI[1] == in_RSI[1])) &&
      (local_11 = false, in_RDI[2] == in_RSI[2])) &&
     (local_11 = false, (int)in_RDI[3] == (int)in_RSI[3])) {
    local_11 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               a,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)b);
  }
  return local_11;
}

Assistant:

bool operator==(const ClockSync& a, const ClockSync& b)
{
  return a.clockValue == b.clockValue
    &&   a.clockFrequency == b.clockFrequency
    &&   a.nsSinceEpoch == b.nsSinceEpoch
    &&   a.tzOffset == b.tzOffset
    &&   a.tzName == b.tzName;
}